

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# HashBinGeneric.h
# Opt level: O3

TldAddressAsKey * __thiscall
BinHash<TldAddressAsKey>::DoInsert
          (BinHash<TldAddressAsKey> *this,TldAddressAsKey *key,bool need_alloc,bool *stored)

{
  TldAddressAsKey **ppTVar1;
  ulong uVar2;
  bool bVar3;
  uint32_t uVar4;
  TldAddressAsKey *key_00;
  
  *stored = false;
  key_00 = (TldAddressAsKey *)0x0;
  if ((key != (TldAddressAsKey *)0x0) && (this->tableSize != 0)) {
    uVar4 = TldAddressAsKey::Hash(key);
    uVar2 = (ulong)uVar4 % (ulong)this->tableSize;
    key_00 = (TldAddressAsKey *)(this->hashBin + uVar2);
    do {
      key_00 = key_00->HashNext;
      if (key_00 == (TldAddressAsKey *)0x0) {
        if (need_alloc) {
          key = TldAddressAsKey::CreateCopy(key);
        }
        if (key != (TldAddressAsKey *)0x0) {
          ppTVar1 = this->hashBin;
          key->HashNext = ppTVar1[uVar2];
          ppTVar1[uVar2] = key;
          *stored = true;
          this->tableCount = this->tableCount + 1;
          return key;
        }
        return (TldAddressAsKey *)0x0;
      }
      bVar3 = TldAddressAsKey::IsSameKey(key,key_00);
    } while (!bVar3);
    key_00->count = key_00->count + key->count;
    key_00->flags = key_00->flags | key->flags;
    *stored = false;
  }
  return key_00;
}

Assistant:

KeyObj * DoInsert(KeyObj * key, bool need_alloc, bool * stored)
    {
        KeyObj * retKey = NULL;

        *stored = false;

        if (key != NULL && tableSize > 0)
        {
            uint32_t hash_index = key->Hash() % tableSize;
            KeyObj * oldKey = hashBin[hash_index];

            while (oldKey != NULL && !key->IsSameKey(oldKey))
            {
                oldKey = oldKey->HashNext;
            }

            if (oldKey != NULL)
            {
                /* the keyed object is already in the table*/
                oldKey->Add(key);
                retKey = oldKey;
                *stored = false;
            }
            else
            {
                retKey = key;

                if (need_alloc)
                {
                    retKey = key->CreateCopy();
                }

                if (retKey != NULL)
                {
                    retKey->HashNext = hashBin[hash_index];
                    hashBin[hash_index] = retKey;
                    *stored = true;
                    tableCount++;
                }
            }
        }

        return retKey;
    }